

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O0

void __thiscall
StdExceptionCatcher_Tests::Test_that_std_exception_catcher_works::test_method
          (Test_that_std_exception_catcher_works *this)

{
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher_1;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<int>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  Test_that_std_exception_catcher_works *this_local;
  
  mittens::std_exception_handler<mittens::UnHandler<int>,int>(1);
  throw_std_exception();
  mittens::std_exception_handler<int>(1);
  throw_std_exception();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_std_exception_catcher_works)
{
   {
      auto catcher = std_exception_handler(EXIT_FAILURE, UnHandler<int>());
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }
   {
      auto catcher = std_exception_handler(EXIT_FAILURE); // default nest handler
      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, catcher.handleException());
      }
   }

}